

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowCodeDefaultStep(Parse *pParse,Select *p,WhereInfo *pWInfo,int regGosub,int addrGosub)

{
  Window *pMWin_00;
  ExprList *pList;
  int iVar1;
  int reg_00;
  int p2;
  int iVar2;
  Vdbe *p_00;
  KeyInfo *pKVar3;
  int local_a0;
  int local_9c;
  KeyInfo *pKeyInfo_1;
  int regPeer;
  int regNewPeer;
  KeyInfo *pKeyInfo;
  int regNewPart;
  int nPeer;
  int addrJump;
  int addrGoto;
  int nPart;
  ExprList *pOrderBy;
  ExprList *pPart;
  int addr;
  int regRowid;
  int regRecord;
  int reg;
  int nSub;
  int iSubCsr;
  int k;
  Vdbe *v;
  Window *pMWin;
  int addrGosub_local;
  int regGosub_local;
  WhereInfo *pWInfo_local;
  Select *p_local;
  Parse *pParse_local;
  
  pMWin_00 = p->pWin;
  p_00 = sqlite3GetVdbe(pParse);
  iVar2 = p->pSrc->a[0].iCursor;
  iVar1 = (int)(p->pSrc->a[0].pTab)->nCol;
  reg_00 = pParse->nMem + 1;
  p2 = reg_00 + iVar1;
  pList = pMWin_00->pPartition;
  _addrGoto = pMWin_00->pOrderBy;
  if (pMWin_00->eEnd == 'W') {
    _addrGoto = (ExprList *)0x0;
  }
  pParse->nMem = iVar1 + 2 + pParse->nMem;
  for (nSub = 0; nSub < iVar1; nSub = nSub + 1) {
    sqlite3VdbeAddOp3(p_00,0x5a,iVar2,nSub,reg_00 + nSub);
  }
  if ((pList != (ExprList *)0x0) || (_addrGoto != (ExprList *)0x0)) {
    if (pList == (ExprList *)0x0) {
      local_9c = 0;
    }
    else {
      local_9c = pList->nExpr;
    }
    nPeer = 0;
    regNewPart = 0;
    if (_addrGoto == (ExprList *)0x0) {
      local_a0 = 0;
    }
    else {
      local_a0 = _addrGoto->nExpr;
    }
    if (pList != (ExprList *)0x0) {
      iVar2 = pMWin_00->nBufferCol;
      pKVar3 = sqlite3KeyInfoFromExprList(pParse,pList,0,0);
      iVar2 = sqlite3VdbeAddOp3(p_00,0x57,reg_00 + iVar2,pMWin_00->regPart,local_9c);
      sqlite3VdbeAppendP4(p_00,pKVar3,-9);
      regNewPart = sqlite3VdbeAddOp3(p_00,0x10,iVar2 + 2,0,iVar2 + 2);
      windowAggFinal(pParse,pMWin_00,1);
      if (_addrGoto != (ExprList *)0x0) {
        nPeer = sqlite3VdbeAddOp0(p_00,0xb);
      }
    }
    if (_addrGoto != (ExprList *)0x0) {
      iVar2 = pMWin_00->nBufferCol;
      iVar1 = pMWin_00->regPart;
      if (regNewPart != 0) {
        sqlite3VdbeJumpHere(p_00,regNewPart);
      }
      if (pMWin_00->eType == 'V') {
        pKVar3 = sqlite3KeyInfoFromExprList(pParse,_addrGoto,0,0);
        iVar2 = sqlite3VdbeAddOp3(p_00,0x57,reg_00 + iVar2 + local_9c,iVar1 + local_9c,local_a0);
        sqlite3VdbeAppendP4(p_00,pKVar3,-9);
        regNewPart = sqlite3VdbeAddOp3(p_00,0x10,iVar2 + 2,0,iVar2 + 2);
      }
      else {
        regNewPart = 0;
      }
      windowAggFinal(pParse,pMWin_00,(uint)(pMWin_00->eStart == 'R'));
      if (nPeer != 0) {
        sqlite3VdbeJumpHere(p_00,nPeer);
      }
    }
    iVar2 = pMWin_00->iEphCsr;
    iVar1 = sqlite3VdbeCurrentAddr(p_00);
    sqlite3VdbeAddOp2(p_00,0x24,iVar2,iVar1 + 3);
    sqlite3VdbeAddOp2(p_00,0xc,regGosub,addrGosub);
    iVar2 = pMWin_00->iEphCsr;
    iVar1 = sqlite3VdbeCurrentAddr(p_00);
    sqlite3VdbeAddOp2(p_00,5,iVar2,iVar1 + -1);
    sqlite3VdbeAddOp1(p_00,0x8b,pMWin_00->iEphCsr);
    sqlite3VdbeAddOp3(p_00,0x4e,reg_00 + pMWin_00->nBufferCol,pMWin_00->regPart,
                      local_9c + local_a0 + -1);
    if (regNewPart != 0) {
      sqlite3VdbeJumpHere(p_00,regNewPart);
    }
  }
  windowAggStep(pParse,pMWin_00,-1,0,reg_00,0);
  if (pMWin_00->nBufferCol < 1) {
    sqlite3VdbeAddOp2(p_00,0x4b,0,p2);
    sqlite3VdbeAppendP4(p_00,"",0);
  }
  else {
    sqlite3VdbeAddOp3(p_00,0x66,reg_00,pMWin_00->nBufferCol,p2);
  }
  sqlite3VdbeAddOp2(p_00,0x79,pMWin_00->iEphCsr,p2 + 1);
  sqlite3VdbeAddOp3(p_00,0x7a,pMWin_00->iEphCsr,p2,p2 + 1);
  sqlite3WhereEnd(pWInfo);
  windowAggFinal(pParse,pMWin_00,1);
  iVar2 = pMWin_00->iEphCsr;
  iVar1 = sqlite3VdbeCurrentAddr(p_00);
  sqlite3VdbeAddOp2(p_00,0x24,iVar2,iVar1 + 3);
  sqlite3VdbeAddOp2(p_00,0xc,regGosub,addrGosub);
  iVar2 = pMWin_00->iEphCsr;
  iVar1 = sqlite3VdbeCurrentAddr(p_00);
  sqlite3VdbeAddOp2(p_00,5,iVar2,iVar1 + -1);
  return;
}

Assistant:

static void windowCodeDefaultStep(
  Parse *pParse, 
  Select *p,
  WhereInfo *pWInfo,
  int regGosub, 
  int addrGosub
){
  Window *pMWin = p->pWin;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int k;
  int iSubCsr = p->pSrc->a[0].iCursor;
  int nSub = p->pSrc->a[0].pTab->nCol;
  int reg = pParse->nMem+1;
  int regRecord = reg+nSub;
  int regRowid = regRecord+1;
  int addr;
  ExprList *pPart = pMWin->pPartition;
  ExprList *pOrderBy = pMWin->pOrderBy;

  assert( pMWin->eType==TK_RANGE 
      || (pMWin->eStart==TK_UNBOUNDED && pMWin->eEnd==TK_CURRENT)
  );

  assert( (pMWin->eStart==TK_UNBOUNDED && pMWin->eEnd==TK_CURRENT)
       || (pMWin->eStart==TK_UNBOUNDED && pMWin->eEnd==TK_UNBOUNDED)
       || (pMWin->eStart==TK_CURRENT && pMWin->eEnd==TK_CURRENT)
       || (pMWin->eStart==TK_CURRENT && pMWin->eEnd==TK_UNBOUNDED && !pOrderBy)
  );

  if( pMWin->eEnd==TK_UNBOUNDED ){
    pOrderBy = 0;
  }

  pParse->nMem += nSub + 2;

  /* Load the individual column values of the row returned by
  ** the sub-select into an array of registers. */
  for(k=0; k<nSub; k++){
    sqlite3VdbeAddOp3(v, OP_Column, iSubCsr, k, reg+k);
  }

  /* Check if this is the start of a new partition or peer group. */
  if( pPart || pOrderBy ){
    int nPart = (pPart ? pPart->nExpr : 0);
    int addrGoto = 0;
    int addrJump = 0;
    int nPeer = (pOrderBy ? pOrderBy->nExpr : 0);

    if( pPart ){
      int regNewPart = reg + pMWin->nBufferCol;
      KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pPart, 0, 0);
      addr = sqlite3VdbeAddOp3(v, OP_Compare, regNewPart, pMWin->regPart,nPart);
      sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
      addrJump = sqlite3VdbeAddOp3(v, OP_Jump, addr+2, 0, addr+2);
      VdbeCoverageEqNe(v);
      windowAggFinal(pParse, pMWin, 1);
      if( pOrderBy ){
        addrGoto = sqlite3VdbeAddOp0(v, OP_Goto);
      }
    }

    if( pOrderBy ){
      int regNewPeer = reg + pMWin->nBufferCol + nPart;
      int regPeer = pMWin->regPart + nPart;

      if( addrJump ) sqlite3VdbeJumpHere(v, addrJump);
      if( pMWin->eType==TK_RANGE ){
        KeyInfo *pKeyInfo = sqlite3KeyInfoFromExprList(pParse, pOrderBy, 0, 0);
        addr = sqlite3VdbeAddOp3(v, OP_Compare, regNewPeer, regPeer, nPeer);
        sqlite3VdbeAppendP4(v, (void*)pKeyInfo, P4_KEYINFO);
        addrJump = sqlite3VdbeAddOp3(v, OP_Jump, addr+2, 0, addr+2);
        VdbeCoverage(v);
      }else{
        addrJump = 0;
      }
      windowAggFinal(pParse, pMWin, pMWin->eStart==TK_CURRENT);
      if( addrGoto ) sqlite3VdbeJumpHere(v, addrGoto);
    }

    sqlite3VdbeAddOp2(v, OP_Rewind, pMWin->iEphCsr,sqlite3VdbeCurrentAddr(v)+3);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Gosub, regGosub, addrGosub);
    sqlite3VdbeAddOp2(v, OP_Next, pMWin->iEphCsr, sqlite3VdbeCurrentAddr(v)-1);
    VdbeCoverage(v);

    sqlite3VdbeAddOp1(v, OP_ResetSorter, pMWin->iEphCsr);
    sqlite3VdbeAddOp3(
        v, OP_Copy, reg+pMWin->nBufferCol, pMWin->regPart, nPart+nPeer-1
    );

    if( addrJump ) sqlite3VdbeJumpHere(v, addrJump);
  }

  /* Invoke step function for window functions */
  windowAggStep(pParse, pMWin, -1, 0, reg, 0);

  /* Buffer the current row in the ephemeral table. */
  if( pMWin->nBufferCol>0 ){
    sqlite3VdbeAddOp3(v, OP_MakeRecord, reg, pMWin->nBufferCol, regRecord);
  }else{
    sqlite3VdbeAddOp2(v, OP_Blob, 0, regRecord);
    sqlite3VdbeAppendP4(v, (void*)"", 0);
  }
  sqlite3VdbeAddOp2(v, OP_NewRowid, pMWin->iEphCsr, regRowid);
  sqlite3VdbeAddOp3(v, OP_Insert, pMWin->iEphCsr, regRecord, regRowid);

  /* End the database scan loop. */
  sqlite3WhereEnd(pWInfo);

  windowAggFinal(pParse, pMWin, 1);
  sqlite3VdbeAddOp2(v, OP_Rewind, pMWin->iEphCsr,sqlite3VdbeCurrentAddr(v)+3);
  VdbeCoverage(v);
  sqlite3VdbeAddOp2(v, OP_Gosub, regGosub, addrGosub);
  sqlite3VdbeAddOp2(v, OP_Next, pMWin->iEphCsr, sqlite3VdbeCurrentAddr(v)-1);
  VdbeCoverage(v);
}